

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,SequenceDistanceGraph&,std::__cxx11::string_const&>
::load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<pybind11::detail::value_and_holder&,SequenceDistanceGraph&,std::__cxx11::string_const&>
           *this,long call)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  undefined8 uVar1;
  handle hVar2;
  long lVar3;
  bool bVar4;
  undefined8 in_RAX;
  long lVar5;
  reference rVar6;
  undefined8 uStack_38;
  
  uVar1 = **(undefined8 **)(call + 8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(call + 0x20);
  uStack_38 = in_RAX;
  std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  *(undefined8 *)(this + 0x38) = uVar1;
  uStack_38._0_6_ = CONCAT15(1,(undefined5)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
  bVar4 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x20),hVar2,(*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_7_ = CONCAT16(bVar4,(undefined6)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,2);
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          *)this,hVar2,(*rVar6._M_p & rVar6._M_mask) != 0);
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    if (lVar5 == 3) break;
    lVar3 = lVar5 + 1;
  } while (*(char *)((long)&uStack_38 + lVar5 + 5) != '\0');
  return lVar5 == 3;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }